

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::handleTransformations(QPDFJob *this,QPDF *pdf)

{
  string *name;
  pointer pPVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  long *plVar6;
  runtime_error *prVar7;
  byte bVar8;
  size_type *psVar9;
  pointer pQVar10;
  QPDFPageObjectHelper *page;
  QPDFPageObjectHelper *pQVar11;
  pointer pPVar12;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar13;
  QPDFPageObjectHelper *pQVar14;
  ulong i;
  QPDF *__args;
  QPDFPageObjectHelper *ph;
  QPDFPageObjectHelper *pQVar15;
  int iVar16;
  int iVar17;
  string_view prefix;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDFObjectHandle page_labels;
  QPDFObjectHandle nums;
  QPDFPageDocumentHelper dh;
  undefined1 local_188 [32];
  QPDFJob *local_168;
  QPDFPageObjectHelper *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  QPDF *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  QPDFPageObjectHelper *local_110;
  QPDFObjectHandle local_108;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  QPDFPageDocumentHelper local_d0;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_d0,pdf);
  peVar5 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_168 = this;
  if (peVar5->remove_restrictions == true) {
    local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8),
               (QPDFAcroFormDocumentHelper **)local_188,
               (allocator<QPDFAcroFormDocumentHelper> *)&local_158,pdf);
    pQVar15 = (QPDFPageObjectHelper *)local_188._8_8_;
    pQVar14 = (QPDFPageObjectHelper *)local_188._0_8_;
    QPDFAcroFormDocumentHelper::disableDigitalSignatures
              ((QPDFAcroFormDocumentHelper *)local_188._0_8_);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    pQVar14 = (QPDFPageObjectHelper *)0x0;
    pQVar15 = (QPDFPageObjectHelper *)0x0;
  }
  if ((peVar5->externalize_inline_images != false) ||
     ((bVar8 = peVar5->optimize_images, (bool)bVar8 == true && (peVar5->keep_inline_images == false)
      ))) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_d0);
    uVar2 = local_188._8_8_;
    for (pQVar11 = (QPDFPageObjectHelper *)local_188._0_8_; pQVar11 != (QPDFPageObjectHelper *)uVar2
        ; pQVar11 = pQVar11 + 1) {
      QPDFPageObjectHelper::externalizeInlineImages
                (pQVar11,((local_168->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         ii_min_bytes,false);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar8 = peVar5->optimize_images;
  }
  local_138 = pdf;
  if ((bVar8 & 1) != 0) {
    local_160 = pQVar15;
    local_110 = pQVar14;
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_d0);
    uVar2 = local_188._8_8_;
    if (local_188._0_8_ != local_188._8_8_) {
      iVar16 = 1;
      pQVar14 = (QPDFPageObjectHelper *)local_188._0_8_;
      do {
        local_e8 = (code *)0x0;
        pcStack_e0 = (code *)0x0;
        local_f8._M_unused._M_object = (void *)0x0;
        local_f8._8_8_ = 0;
        local_f8._M_unused._M_object = operator_new(0x18);
        *(QPDFJob **)local_f8._M_unused._0_8_ = local_168;
        *(int *)((long)local_f8._M_unused._0_8_ + 8) = iVar16;
        *(QPDF **)((long)local_f8._M_unused._0_8_ + 0x10) = local_138;
        pcStack_e0 = std::
                     _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2205:17)>
                     ::_M_invoke;
        local_e8 = std::
                   _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2205:17)>
                   ::_M_manager;
        QPDFPageObjectHelper::forEachImage
                  (pQVar14,true,
                   (function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_f8);
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_f8,&local_f8,__destroy_functor);
        }
        pQVar14 = pQVar14 + 1;
        iVar16 = iVar16 + 1;
      } while (pQVar14 != (QPDFPageObjectHelper *)uVar2);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pQVar14 = local_110;
    pQVar15 = local_160;
  }
  __args = local_138;
  if (peVar5->generate_appearances == true) {
    pQVar11 = pQVar15;
    if (pQVar14 == (QPDFPageObjectHelper *)0x0) {
      local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8),
                 (QPDFAcroFormDocumentHelper **)local_188,
                 (allocator<QPDFAcroFormDocumentHelper> *)&local_158,local_138);
      pQVar11 = (QPDFPageObjectHelper *)local_188._8_8_;
      pQVar14 = (QPDFPageObjectHelper *)local_188._0_8_;
      local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
      local_188._8_8_ = (QPDFPageObjectHelper *)0x0;
      if ((pQVar15 != (QPDFPageObjectHelper *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pQVar15),
         (QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
    }
    QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded((QPDFAcroFormDocumentHelper *)pQVar14);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pQVar15 = pQVar11;
  }
  if (peVar5->flatten_annotations == true) {
    QPDFPageDocumentHelper::flattenAnnotations
              (&local_d0,peVar5->flatten_annotations_required,peVar5->flatten_annotations_forbidden)
    ;
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar5->coalesce_contents == true) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_d0);
    uVar2 = local_188._8_8_;
    for (pQVar11 = (QPDFPageObjectHelper *)local_188._0_8_; pQVar11 != (QPDFPageObjectHelper *)uVar2
        ; pQVar11 = pQVar11 + 1) {
      QPDFPageObjectHelper::coalesceContentStreams(pQVar11);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar5->flatten_rotation == true) {
    pQVar11 = pQVar15;
    if (pQVar14 == (QPDFPageObjectHelper *)0x0) {
      local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8),
                 (QPDFAcroFormDocumentHelper **)local_188,
                 (allocator<QPDFAcroFormDocumentHelper> *)&local_158,__args);
      pQVar11 = (QPDFPageObjectHelper *)local_188._8_8_;
      pQVar14 = (QPDFPageObjectHelper *)local_188._0_8_;
      local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
      local_188._8_8_ = (QPDFPageObjectHelper *)0x0;
      if ((pQVar15 != (QPDFPageObjectHelper *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pQVar15),
         (QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
    }
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_d0);
    uVar2 = local_188._8_8_;
    for (pQVar15 = (QPDFPageObjectHelper *)local_188._0_8_; pQVar15 != (QPDFPageObjectHelper *)uVar2
        ; pQVar15 = pQVar15 + 1) {
      QPDFPageObjectHelper::flattenRotation(pQVar15,(QPDFAcroFormDocumentHelper *)pQVar14);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pQVar15 = pQVar11;
  }
  if (peVar5->remove_page_labels == true) {
    QPDF::getRoot((QPDF *)&local_158);
    local_188._0_8_ = (QPDFPageObjectHelper *)(local_188 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/PageLabels","");
    QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_158,(string *)local_188);
    if ((QPDFPageObjectHelper *)local_188._0_8_ != (QPDFPageObjectHelper *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
    }
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  local_160 = pQVar15;
  if ((peVar5->page_label_specs).
      super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>._M_impl.
      super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar5->page_label_specs).
               super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>.
               _M_impl.super__Vector_impl_data + 8)) {
    QPDFObjectHandle::newArray();
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_d0);
    i = ((long)(local_188._8_8_ - local_188._0_8_) >> 3) * 0x6db6db6db6db6db7;
    if ((i & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pPVar12 = (peVar5->page_label_specs).
              super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = *(pointer *)
              ((long)&(peVar5->page_label_specs).
                      super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pPVar12 != pPVar1) {
      iVar16 = (int)i;
      local_110 = (QPDFPageObjectHelper *)CONCAT44(local_110._4_4_,iVar16 + 1);
      iVar4 = 0;
      do {
        iVar17 = pPVar12->first_page;
        if (iVar17 < 0) {
          iVar17 = iVar17 + (int)local_110;
          pPVar12->first_page = iVar17;
        }
        if (iVar4 == 0) {
          if (iVar17 != 1) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar7,"the first page label specification must start with page 1");
            goto LAB_00175452;
          }
        }
        else if (iVar17 <= iVar4) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar7,"page label specifications must be in order by first page");
LAB_00175452:
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (iVar16 < iVar17) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_90,pPVar12->first_page);
          std::operator+(&local_50,"page label spec: page ",&local_90);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_130._M_dataplus._M_p = (pointer)*plVar6;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_130._M_dataplus._M_p == psVar9) {
            local_130.field_2._M_allocated_capacity = *psVar9;
            local_130.field_2._8_8_ = plVar6[3];
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar9;
          }
          local_130._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::to_string(&local_70,iVar16);
          std::operator+(&local_158,&local_130,&local_70);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_188._0_8_ = *plVar6;
          pQVar10 = (pointer)(plVar6 + 2);
          if ((pointer)local_188._0_8_ == pQVar10) {
            local_188._16_8_ = (pQVar10->super_QPDFObjectHelper)._vptr_QPDFObjectHelper;
            local_188._24_8_ = plVar6[3];
            local_188._0_8_ = (pointer)(local_188 + 0x10);
          }
          else {
            local_188._16_8_ = (pQVar10->super_QPDFObjectHelper)._vptr_QPDFObjectHelper;
          }
          local_188._8_8_ = plVar6[1];
          *plVar6 = (long)pQVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::runtime_error::runtime_error(prVar7,(string *)local_188);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        QPDFObjectHandle::newInteger((QPDFObjectHandle *)local_188,(long)(iVar17 + -1));
        QPDFObjectHandle::appendItem(&local_108,(QPDFObjectHandle *)local_188);
        if ((QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
        }
        prefix._M_len = (ulong)(uint)pPVar12->start_num;
        prefix._M_str = (char *)(pPVar12->prefix)._M_string_length;
        QPDFPageLabelDocumentHelper::pageLabelDict
                  ((qpdf_page_label_e)local_188,pPVar12->label_type,prefix);
        QPDFObjectHandle::appendItem(&local_108,(QPDFObjectHandle *)local_188);
        if ((QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
        }
        pPVar12 = pPVar12 + 1;
        iVar4 = iVar17;
      } while (pPVar12 != pPVar1);
    }
    QPDFObjectHandle::newDictionary();
    pQVar14 = (QPDFPageObjectHelper *)(local_188 + 0x10);
    local_188._0_8_ = pQVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/Nums","");
    __args = local_138;
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_158,(string *)local_188,&local_108);
    pQVar15 = local_160;
    if ((QPDFPageObjectHelper *)local_188._0_8_ != pQVar14) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    QPDF::getRoot((QPDF *)&local_130);
    local_188._0_8_ = pQVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/PageLabels","");
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)&local_130,(string *)local_188,(QPDFObjectHandle *)&local_158);
    if ((QPDFPageObjectHelper *)local_188._0_8_ != pQVar14) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
    }
    if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)*(undefined1 **)
          &(peVar5->attachments_to_remove).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base != &peVar5->attachments_to_remove) {
    QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)local_188,__args);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    plVar6 = *(long **)&(peVar5->attachments_to_remove).
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node.super__List_node_base;
    plVar13 = &peVar5->attachments_to_remove;
    if ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)plVar6 != plVar13) {
      do {
        name = (string *)(plVar6 + 2);
        bVar3 = QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile
                          ((QPDFEmbeddedFileDocumentHelper *)local_188,name);
        if (!bVar3) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_130,"attachment ",name);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_158._M_dataplus._M_p = (pointer)*plVar6;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_158._M_dataplus._M_p == psVar9) {
            local_158.field_2._M_allocated_capacity = *psVar9;
            local_158.field_2._8_8_ = plVar6[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar9;
          }
          local_158._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::runtime_error::runtime_error(prVar7,(string *)&local_158);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_b0._8_8_ = 0;
        local_98 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2283:29)>
                   ::_M_invoke;
        local_a0 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2283:29)>
                   ::_M_manager;
        local_b0._M_unused._M_object = name;
        doIfVerbose(local_168,
                    (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_b0);
        if (local_a0 != (code *)0x0) {
          (*local_a0)(&local_b0,&local_b0,__destroy_functor);
        }
        plVar6 = (long *)*plVar6;
      } while ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)plVar6 != plVar13);
    }
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)local_188);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __args = local_138;
    pQVar15 = local_160;
  }
  if ((list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *)
      *(undefined1 **)
       &(peVar5->attachments_to_add).
        super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>._M_impl.
        _M_node.super__List_node_base != &peVar5->attachments_to_add) {
    addAttachments(local_168,__args);
    peVar5 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *)
      *(undefined1 **)
       &(peVar5->attachments_to_copy).
        super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>.
        _M_impl._M_node.super__List_node_base != &peVar5->attachments_to_copy) {
    copyAttachments(local_168,__args);
  }
  if (pQVar15 != (QPDFPageObjectHelper *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pQVar15);
  }
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_d0);
  return;
}

Assistant:

void
QPDFJob::handleTransformations(QPDF& pdf)
{
    QPDFPageDocumentHelper dh(pdf);
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdh;
    auto make_afdh = [&]() {
        if (!afdh.get()) {
            afdh = std::make_shared<QPDFAcroFormDocumentHelper>(pdf);
        }
    };
    if (m->remove_restrictions) {
        make_afdh();
        afdh->disableDigitalSignatures();
    }
    if (m->externalize_inline_images || (m->optimize_images && (!m->keep_inline_images))) {
        for (auto& ph: dh.getAllPages()) {
            ph.externalizeInlineImages(m->ii_min_bytes);
        }
    }
    if (m->optimize_images) {
        int pageno = 0;
        for (auto& ph: dh.getAllPages()) {
            ++pageno;
            ph.forEachImage(
                true,
                [this, pageno, &pdf](
                    QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key) {
                    auto io = std::make_unique<ImageOptimizer>(
                        *this,
                        m->oi_min_width,
                        m->oi_min_height,
                        m->oi_min_area,
                        m->jpeg_quality,
                        obj);
                    if (io->evaluate("image " + key + " on page " + std::to_string(pageno))) {
                        QPDFObjectHandle new_image = pdf.newStream();
                        new_image.replaceDict(obj.getDict().shallowCopy());
                        new_image.replaceStreamData(
                            std::move(io),
                            QPDFObjectHandle::newName("/DCTDecode"),
                            QPDFObjectHandle::newNull());
                        xobj_dict.replaceKey(key, new_image);
                    }
                });
        }
    }
    if (m->generate_appearances) {
        make_afdh();
        afdh->generateAppearancesIfNeeded();
    }
    if (m->flatten_annotations) {
        dh.flattenAnnotations(m->flatten_annotations_required, m->flatten_annotations_forbidden);
    }
    if (m->coalesce_contents) {
        for (auto& page: dh.getAllPages()) {
            page.coalesceContentStreams();
        }
    }
    if (m->flatten_rotation) {
        make_afdh();
        for (auto& page: dh.getAllPages()) {
            page.flattenRotation(afdh.get());
        }
    }
    if (m->remove_page_labels) {
        pdf.getRoot().removeKey("/PageLabels");
    }
    if (!m->page_label_specs.empty()) {
        auto nums = QPDFObjectHandle::newArray();
        auto n_pages = QIntC::to_int(dh.getAllPages().size());
        int last_page_seen{0};
        for (auto& spec: m->page_label_specs) {
            if (spec.first_page < 0) {
                spec.first_page = n_pages + 1 + spec.first_page;
            }
            if (last_page_seen == 0) {
                if (spec.first_page != 1) {
                    throw std::runtime_error(
                        "the first page label specification must start with page 1");
                }
            } else if (spec.first_page <= last_page_seen) {
                throw std::runtime_error(
                    "page label specifications must be in order by first page");
            }
            if (spec.first_page > n_pages) {
                throw std::runtime_error(
                    "page label spec: page " + std::to_string(spec.first_page) +
                    " is more than the total number of pages (" + std::to_string(n_pages) + ")");
            }
            last_page_seen = spec.first_page;
            nums.appendItem(QPDFObjectHandle::newInteger(spec.first_page - 1));
            nums.appendItem(
                QPDFPageLabelDocumentHelper::pageLabelDict(
                    spec.label_type, spec.start_num, spec.prefix));
        }
        auto page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", nums);
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }
    if (!m->attachments_to_remove.empty()) {
        QPDFEmbeddedFileDocumentHelper efdh(pdf);
        for (auto const& key: m->attachments_to_remove) {
            if (efdh.removeEmbeddedFile(key)) {
                doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                    v << prefix << ": removed attachment " << key << "\n";
                });
            } else {
                throw std::runtime_error("attachment " + key + " not found");
            }
        }
    }
    if (!m->attachments_to_add.empty()) {
        addAttachments(pdf);
    }
    if (!m->attachments_to_copy.empty()) {
        copyAttachments(pdf);
    }
}